

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void c4::detail::base64_test_tables(void)

{
  bool bVar1;
  error_flags eVar2;
  char s2c_1;
  char c2s_1;
  size_t i_1;
  char c2s;
  char s2c;
  size_t i;
  ulong local_28;
  ulong local_8;
  
  for (local_8 = 0; local_8 < 0x40; local_8 = local_8 + 1) {
    if ((long)(char)base64_char_to_sextet_[(int)(char)base64_sextet_to_char_[local_8]] != local_8) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      handle_error(0x345f1b,(char *)0x459a,"check failed: %s","(size_t)c2s == i");
    }
  }
  for (local_28 = 0; local_28 < 0x80; local_28 = local_28 + 1) {
    if ((base64_char_to_sextet_[local_28] != -1) &&
       ((long)(char)base64_sextet_to_char_[(int)(char)base64_char_to_sextet_[local_28]] != local_28)
       ) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      handle_error(0x345f1b,(char *)0x45a2,"check failed: %s","(size_t)s2c == i");
    }
  }
  return;
}

Assistant:

void base64_test_tables()
{
    for(size_t i = 0; i < C4_COUNTOF(detail::base64_sextet_to_char_); ++i)
    {
        char s2c = base64_sextet_to_char_[i];
        char c2s = base64_char_to_sextet_[(int)s2c];
        C4_CHECK((size_t)c2s == i);
    }
    for(size_t i = 0; i < C4_COUNTOF(detail::base64_char_to_sextet_); ++i)
    {
        char c2s = base64_char_to_sextet_[i];
        if(c2s == char(-1))
            continue;
        char s2c = base64_sextet_to_char_[(int)c2s];
        C4_CHECK((size_t)s2c == i);
    }
}